

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::ConvertToHalfPass::IsDecoratedRelaxed(ConvertToHalfPass *this,Instruction *inst)

{
  uint32_t uVar1;
  DecorationManager *this_00;
  pointer ppIVar2;
  _Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_38
  ;
  
  uVar1 = Instruction::result_id(inst);
  this_00 = Pass::get_decoration_mgr(&this->super_Pass);
  analysis::DecorationManager::GetDecorationsFor
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &local_38,this_00,uVar1,false);
  for (ppIVar2 = local_38._M_impl.super__Vector_impl_data._M_start;
      ppIVar2 != local_38._M_impl.super__Vector_impl_data._M_finish; ppIVar2 = ppIVar2 + 1) {
    if ((*ppIVar2)->opcode_ == OpDecorate) {
      uVar1 = Instruction::GetSingleWordInOperand(*ppIVar2,1);
      if (uVar1 == 0) break;
    }
  }
  std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Vector_base(&local_38);
  return ppIVar2 != local_38._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool ConvertToHalfPass::IsDecoratedRelaxed(Instruction* inst) {
  uint32_t r_id = inst->result_id();
  for (auto r_inst : get_decoration_mgr()->GetDecorationsFor(r_id, false))
    if (r_inst->opcode() == spv::Op::OpDecorate &&
        spv::Decoration(r_inst->GetSingleWordInOperand(1)) ==
            spv::Decoration::RelaxedPrecision) {
      return true;
    }
  return false;
}